

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingNegativeCase::generateShaders
          (ImageBindingNegativeCase *this)

{
  string *psVar1;
  ShaderType SVar2;
  DataType DVar3;
  uint uVar4;
  char *pcVar5;
  ostream *poVar6;
  ShaderProgram *this_00;
  uint uVar7;
  uint uVar8;
  int iVar9;
  DataType dataType;
  ulong uVar10;
  long lVar11;
  string imageType;
  string texCoordType;
  ProgramSources sources;
  ostringstream shaderBody;
  ostringstream tessEvalUniformDecl;
  ostringstream tessCtrlUniformDecl;
  ostringstream fragmentUniformDecl;
  ostringstream vertexUniformDecl;
  string local_b28;
  string local_b08;
  uint local_ae8;
  value_type local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  long *local_a60;
  long local_a58;
  long local_a50 [2];
  undefined1 local_a40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a30;
  ulong local_a18;
  long *local_a10;
  long local_a08;
  long local_a00 [2];
  string local_9f0;
  undefined1 local_9d0 [112];
  ios_base local_960 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_940;
  deUint32 local_928;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_920;
  bool local_908;
  undefined1 local_858 [16];
  size_type local_848;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_840 [7];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_7c8;
  deUint32 local_7b0;
  undefined1 local_7a8 [24];
  undefined1 local_790;
  undefined1 local_788 [376];
  undefined1 local_610 [376];
  undefined1 local_498 [376];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_788);
  iVar9 = *(int *)&(this->super_LayoutBindingNegativeCase).field_0x134;
  DVar3 = TYPE_INT_VEC3;
  if (iVar9 != 0x904e) {
    DVar3 = TYPE_INVALID;
  }
  dataType = TYPE_INT_VEC2;
  if (iVar9 != 0x904d) {
    dataType = DVar3;
  }
  pcVar5 = glu::getDataTypeName(dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a10,pcVar5,(allocator<char> *)local_9d0);
  DVar3 = glu::getDataTypeFromGLType
                    (*(deUint32 *)&(this->super_LayoutBindingNegativeCase).field_0x134);
  pcVar5 = glu::getDataTypeName(DVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a60,pcVar5,(allocator<char> *)local_9d0);
  uVar4 = (this->super_LayoutBindingNegativeCase).m_numBindings;
  uVar8 = (this->super_LayoutBindingNegativeCase).m_testType - TESTTYPE_BINDING_ARRAY;
  uVar7 = 1;
  if (1 < uVar8) {
    uVar7 = uVar4;
  }
  if (0 < (int)uVar7) {
    psVar1 = &(this->super_LayoutBindingNegativeCase).m_uniformName;
    local_a18 = (ulong)uVar7;
    uVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(rgba8, binding = ",0x18);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (local_1a8,
                          (this->super_LayoutBindingNegativeCase).m_vertexShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") uniform readonly highp ",0x19);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_a60,local_a58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      iVar9 = (int)uVar10;
      if (uVar8 < 2) {
        getUniformName((string *)local_9d0,psVar1,iVar9,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
      }
      else {
        getUniformName((string *)local_9d0,psVar1,iVar9);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_9d0._0_8_,local_9d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
      if ((undefined1 *)local_9d0._0_8_ != local_9d0 + 0x10) {
        operator_delete((void *)local_9d0._0_8_,local_9d0._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"layout(rgba8, binding = ",0x18);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (local_320,
                          (this->super_LayoutBindingNegativeCase).m_fragmentShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") uniform readonly highp ",0x19);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_a60,local_a58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      if (uVar8 < 2) {
        getUniformName((string *)local_9d0,psVar1,iVar9,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
      }
      else {
        getUniformName((string *)local_9d0,psVar1,iVar9);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_9d0._0_8_,local_9d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
      if ((undefined1 *)local_9d0._0_8_ != local_9d0 + 0x10) {
        operator_delete((void *)local_9d0._0_8_,local_9d0._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_498,"layout(rgba8, binding = ",0x18);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (local_498,
                          (this->super_LayoutBindingNegativeCase).m_tessCtrlShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") uniform readonly highp ",0x19);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_a60,local_a58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      if (uVar8 < 2) {
        getUniformName((string *)local_9d0,psVar1,iVar9,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
      }
      else {
        getUniformName((string *)local_9d0,psVar1,iVar9);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_9d0._0_8_,local_9d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
      if ((undefined1 *)local_9d0._0_8_ != local_9d0 + 0x10) {
        operator_delete((void *)local_9d0._0_8_,local_9d0._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_610,"layout(rgba8, binding = ",0x18);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (local_610,
                          (this->super_LayoutBindingNegativeCase).m_tessEvalShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") uniform readonly highp ",0x19);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_a60,local_a58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      if (uVar8 < 2) {
        getUniformName((string *)local_9d0,psVar1,iVar9,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
      }
      else {
        getUniformName((string *)local_9d0,psVar1,iVar9);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_9d0._0_8_,local_9d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
      if ((undefined1 *)local_9d0._0_8_ != local_9d0 + 0x10) {
        operator_delete((void *)local_9d0._0_8_,local_9d0._16_8_ + 1);
      }
      uVar10 = uVar10 + 1;
    } while (local_a18 != uVar10);
    uVar4 = (this->super_LayoutBindingNegativeCase).m_numBindings;
  }
  if (0 < (int)uVar4) {
    psVar1 = &(this->super_LayoutBindingNegativeCase).m_uniformName;
    iVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\t",1);
      pcVar5 = "else if";
      if (iVar9 == 0) {
        pcVar5 = "if";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_788,pcVar5,(ulong)(iVar9 != 0) * 5 + 2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_788," (u_arrayNdx == ",0x10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9d0);
      std::ostream::operator<<((string *)local_9d0,iVar9);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9d0);
      std::ios_base::~ios_base(local_960);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_788,(char *)CONCAT44(local_858._4_4_,local_858._0_4_),
                          local_858._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t{\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t\tcolor = imageLoad(",0x14);
      if (uVar8 < 2) {
        getUniformName((string *)local_9d0,psVar1,0,iVar9);
      }
      else {
        getUniformName((string *)local_9d0,psVar1,iVar9);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_9d0._0_8_,local_9d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_a10,local_a08);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(0));\n",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t}\n",3);
      if ((undefined1 *)local_9d0._0_8_ != local_9d0 + 0x10) {
        operator_delete((void *)local_9d0._0_8_,local_9d0._16_8_ + 1);
      }
      if ((size_type *)CONCAT44(local_858._4_4_,local_858._0_4_) != &local_848) {
        operator_delete((size_type *)CONCAT44(local_858._4_4_,local_858._0_4_),local_848 + 1);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < (this->super_LayoutBindingNegativeCase).m_numBindings);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\telse\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_788,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\t}\n",3);
  memset(local_858,0,0xac);
  local_7a8._0_8_ = (pointer)0x0;
  local_7a8[8] = 0;
  local_7a8._9_7_ = 0;
  local_7a8[0x10] = 0;
  stack0xfffffffffffff869 = 0;
  SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateVertexShader(&local_b08,SVar2,&local_aa0,&local_a80);
  local_ae8 = 0;
  local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ae0,local_b08._M_dataplus._M_p,
             local_b08._M_dataplus._M_p + local_b08._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_858 + (ulong)local_ae8 * 0x18),&local_ae0);
  SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateFragmentShader(&local_b28,SVar2,&local_ac0,&local_9f0);
  local_a40._0_4_ = 1;
  local_a40._8_8_ = local_a30._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_a40 + 8),local_b28._M_dataplus._M_p,
             local_b28._M_dataplus._M_p + local_b28._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_858 + (ulong)(uint)local_a40._0_4_ * 0x18),(value_type *)(local_a40 + 8));
  lVar11 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_9d0 + lVar11),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_858 + lVar11));
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&vStack_940,&vStack_7c8);
  local_928 = local_7b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_920,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_7a8);
  local_908 = (bool)local_790;
  if ((char *)local_a40._8_8_ != local_a30._M_local_buf + 8) {
    operator_delete((void *)local_a40._8_8_,local_a30._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
    operator_delete(local_ae0._M_dataplus._M_p,local_ae0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p,local_b08.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_7a8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&vStack_7c8);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_858 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  if ((this->super_LayoutBindingNegativeCase).m_tessSupport == true) {
    SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    generateTessControlShader((string *)local_a40,SVar2,&local_b08,&local_aa0);
    local_858._0_4_ = 3;
    local_858._8_8_ = local_840;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_858 + 8),CONCAT44(local_a40._4_4_,local_a40._0_4_),
               (char *)(local_a40._8_8_ + CONCAT44(local_a40._4_4_,local_a40._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_9d0 + (ulong)(uint)local_858._0_4_ * 0x18),(value_type *)(local_858 + 8));
    SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    generateTessEvaluationShader(&local_a80,SVar2,&local_b28,&local_ac0);
    local_ae8 = 4;
    local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ae0,local_a80._M_dataplus._M_p,
               local_a80._M_dataplus._M_p + local_a80._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_9d0 + (ulong)local_ae8 * 0x18),&local_ae0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
      operator_delete(local_ae0._M_dataplus._M_p,local_ae0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
      operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
      operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
      operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858._8_8_ != local_840) {
      operator_delete((void *)local_858._8_8_,local_840[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_a40._4_4_,local_a40._0_4_) != &local_a30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_a40._4_4_,local_a40._0_4_),
                      local_a30._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
      operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
      operator_delete(local_b08._M_dataplus._M_p,local_b08.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_00,((this->super_LayoutBindingNegativeCase).super_TestCase.m_context)->m_renderCtx
             ,(ProgramSources *)local_9d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_920);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&vStack_940);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_9d0 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  if (local_a60 != local_a50) {
    operator_delete(local_a60,local_a50[0] + 1);
  }
  if (local_a10 != local_a00) {
    operator_delete(local_a10,local_a00[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_788);
  std::ios_base::~ios_base((ios_base *)(local_788 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
  std::ios_base::~ios_base((ios_base *)(local_610 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base((ios_base *)(local_498 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return this_00;
}

Assistant:

glu::ShaderProgram* ImageBindingNegativeCase::generateShaders (void) const
{
	std::ostringstream		vertexUniformDecl;
	std::ostringstream		fragmentUniformDecl;
	std::ostringstream		tessCtrlUniformDecl;
	std::ostringstream		tessEvalUniformDecl;
	std::ostringstream		shaderBody;

	const std::string		texCoordType	= glu::getDataTypeName(getImageTexCoordType());
	const std::string		imageType		= glu::getDataTypeName(glu::getDataTypeFromGLType(m_imageType));
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		vertexUniformDecl << "layout(rgba8, binding = " << m_vertexShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
		fragmentUniformDecl << "layout(rgba8, binding = " << m_fragmentShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
		tessCtrlUniformDecl << "layout(rgba8, binding = " << m_tessCtrlShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
		tessEvalUniformDecl << "layout(rgba8, binding = " << m_tessEvalShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings; ++bindNdx)
	{
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = imageLoad(" << (arrayInstance ? getUniformName(m_uniformName, 0, bindNdx) : getUniformName(m_uniformName, bindNdx)) << ", " << texCoordType << "(0));\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	glu::ProgramSources sources = glu::ProgramSources()
				<< glu::VertexSource(generateVertexShader(m_shaderType, vertexUniformDecl.str(), shaderBody.str()))
				<< glu::FragmentSource(generateFragmentShader(m_shaderType, fragmentUniformDecl.str(), shaderBody.str()));

	if (m_tessSupport)
		sources << glu::TessellationControlSource(generateTessControlShader(m_shaderType, tessCtrlUniformDecl.str(), shaderBody.str()))
				<< glu::TessellationEvaluationSource(generateTessEvaluationShader(m_shaderType, tessEvalUniformDecl.str(), shaderBody.str()));

	return new glu::ShaderProgram(m_context.getRenderContext(), sources);
}